

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_true>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  _func_int **pp_Var22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  undefined1 (*pauVar28) [32];
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  byte bVar32;
  ushort uVar33;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  vint<8> mask;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  RTCIntersectFunctionNArguments local_5988;
  Geometry *local_5958;
  undefined8 local_5950;
  RTCIntersectArguments *local_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 uStack_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar38 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
    uVar30 = vpcmpeqd_avx512vl(auVar38,(undefined1  [32])valid_i->field_0);
    bVar32 = (byte)uVar30;
    if (bVar32 != 0) {
      auVar38 = *(undefined1 (*) [32])(ray + 0x80);
      auVar39 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar36 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42._16_4_ = 0x7fffffff;
      auVar42._20_4_ = 0x7fffffff;
      auVar42._24_4_ = 0x7fffffff;
      auVar42._28_4_ = 0x7fffffff;
      auVar37 = vandps_avx(auVar36,auVar42);
      auVar43._8_4_ = 0x219392ef;
      auVar43._0_8_ = 0x219392ef219392ef;
      auVar43._12_4_ = 0x219392ef;
      auVar43._16_4_ = 0x219392ef;
      auVar43._20_4_ = 0x219392ef;
      auVar43._24_4_ = 0x219392ef;
      auVar43._28_4_ = 0x219392ef;
      uVar25 = vcmpps_avx512vl(auVar37,auVar43,1);
      bVar3 = (bool)((byte)uVar25 & 1);
      auVar37._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._0_4_;
      bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar37._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._4_4_;
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar37._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._8_4_;
      bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar37._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._12_4_;
      bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
      auVar37._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._16_4_;
      bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
      auVar37._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._20_4_;
      bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
      auVar37._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._24_4_;
      bVar3 = SUB81(uVar25 >> 7,0);
      auVar37._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._28_4_;
      auVar35 = vrcp14ps_avx512vl(auVar37);
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = &DAT_3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar44._16_4_ = 0x3f800000;
      auVar44._20_4_ = 0x3f800000;
      auVar44._24_4_ = 0x3f800000;
      auVar44._28_4_ = 0x3f800000;
      auVar13 = vfnmadd213ps_fma(auVar37,auVar35,auVar44);
      auVar36 = vandps_avx(auVar39,auVar42);
      uVar25 = vcmpps_avx512vl(auVar36,auVar43,1);
      bVar3 = (bool)((byte)uVar25 & 1);
      auVar36._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._0_4_;
      bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._4_4_;
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._8_4_;
      bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._12_4_;
      bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._16_4_;
      bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._20_4_;
      bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._24_4_;
      bVar3 = SUB81(uVar25 >> 7,0);
      auVar36._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar39._28_4_;
      auVar37 = vrcp14ps_avx512vl(auVar36);
      auVar14 = vfnmadd213ps_fma(auVar36,auVar37,auVar44);
      auVar39 = vandps_avx(auVar38,auVar42);
      uVar25 = vcmpps_avx512vl(auVar39,auVar43,1);
      bVar3 = (bool)((byte)uVar25 & 1);
      auVar39._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._0_4_;
      bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._4_4_;
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._8_4_;
      bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._12_4_;
      bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._16_4_;
      bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._20_4_;
      bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._24_4_;
      bVar3 = SUB81(uVar25 >> 7,0);
      auVar39._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._28_4_;
      auVar38 = vrcp14ps_avx512vl(auVar39);
      auVar15 = vfnmadd213ps_fma(auVar39,auVar38,auVar44);
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar38,auVar38);
      auVar55 = ZEXT1664(auVar15);
      auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar37,auVar37);
      auVar56 = ZEXT1664(auVar14);
      auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar35,auVar35);
      auVar57 = ZEXT1664(auVar13);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar58 = ZEXT3264(local_4680);
      auVar38 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
      local_4660._0_4_ = (uint)(bVar32 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar32 & 1) * 0x7f800000
      ;
      bVar3 = (bool)((byte)(uVar30 >> 1) & 1);
      local_4660._4_4_ = (uint)bVar3 * auVar38._4_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar30 >> 2) & 1);
      local_4660._8_4_ = (uint)bVar3 * auVar38._8_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar30 >> 3) & 1);
      local_4660._12_4_ = (uint)bVar3 * auVar38._12_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar30 >> 4) & 1);
      local_4660._16_4_ = (uint)bVar3 * auVar38._16_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar30 >> 5) & 1);
      local_4660._20_4_ = (uint)bVar3 * auVar38._20_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar30 >> 6) & 1);
      local_4660._24_4_ = (uint)bVar3 * auVar38._24_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = SUB81(uVar30 >> 7,0);
      local_4660._28_4_ = (uint)bVar3 * auVar38._28_4_ | (uint)!bVar3 * 0x7f800000;
      auVar59 = ZEXT3264(local_4660);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar39 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40));
      bVar3 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar31 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar8 = SUB81(uVar30 >> 7,0);
      auVar60 = ZEXT3264(CONCAT428((uint)bVar8 * auVar39._28_4_ | (uint)!bVar8 * auVar38._28_4_,
                                   CONCAT424((uint)bVar7 * auVar39._24_4_ |
                                             (uint)!bVar7 * auVar38._24_4_,
                                             CONCAT420((uint)bVar6 * auVar39._20_4_ |
                                                       (uint)!bVar6 * auVar38._20_4_,
                                                       CONCAT416((uint)bVar5 * auVar39._16_4_ |
                                                                 (uint)!bVar5 * auVar38._16_4_,
                                                                 CONCAT412((uint)bVar4 *
                                                                           auVar39._12_4_ |
                                                                           (uint)!bVar4 *
                                                                           auVar38._12_4_,
                                                                           CONCAT48((uint)bVar31 *
                                                                                    auVar39._8_4_ |
                                                                                    (uint)!bVar31 *
                                                                                    auVar38._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar3 * auVar39._4_4_ |
                                                  (uint)!bVar3 * auVar38._4_4_,
                                                  (uint)(bVar32 & 1) * auVar39._0_4_ |
                                                  (uint)!(bool)(bVar32 & 1) * auVar38._0_4_))))))));
      puVar27 = local_5808 + 1;
      auVar38 = *(undefined1 (*) [32])ray;
      auVar40._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = auVar38._8_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar38._12_4_ ^ 0x80000000;
      auVar40._16_4_ = auVar38._16_4_ ^ 0x80000000;
      auVar40._20_4_ = auVar38._20_4_ ^ 0x80000000;
      auVar40._24_4_ = auVar38._24_4_ ^ 0x80000000;
      auVar40._28_4_ = auVar38._28_4_ ^ 0x80000000;
      pauVar28 = (undefined1 (*) [32])local_4640;
      auVar38 = vmulps_avx512vl(ZEXT1632(auVar15),auVar40);
      auVar61 = ZEXT3264(auVar38);
      auVar38 = *(undefined1 (*) [32])(ray + 0x20);
      auVar41._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = auVar38._8_4_ ^ 0x80000000;
      auVar41._12_4_ = auVar38._12_4_ ^ 0x80000000;
      auVar41._16_4_ = auVar38._16_4_ ^ 0x80000000;
      auVar41._20_4_ = auVar38._20_4_ ^ 0x80000000;
      auVar41._24_4_ = auVar38._24_4_ ^ 0x80000000;
      auVar41._28_4_ = auVar38._28_4_ ^ 0x80000000;
      auVar38 = *(undefined1 (*) [32])(ray + 0x40);
      auVar35._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = auVar38._8_4_ ^ 0x80000000;
      auVar35._12_4_ = auVar38._12_4_ ^ 0x80000000;
      auVar35._16_4_ = auVar38._16_4_ ^ 0x80000000;
      auVar35._20_4_ = auVar38._20_4_ ^ 0x80000000;
      auVar35._24_4_ = auVar38._24_4_ ^ 0x80000000;
      auVar35._28_4_ = auVar38._28_4_ ^ 0x80000000;
      auVar38 = vmulps_avx512vl(ZEXT1632(auVar14),auVar41);
      auVar62 = ZEXT3264(auVar38);
      auVar38 = vmulps_avx512vl(ZEXT1632(auVar13),auVar35);
      auVar63 = ZEXT3264(auVar38);
      uStack_5810 = 0xfffffffffffffff8;
      local_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      do {
        auVar38 = auVar60._0_32_;
        pauVar28 = pauVar28 + -1;
        uVar30 = puVar27[-1];
        puVar27 = puVar27 + -1;
        bVar3 = true;
        if (uVar30 != 0xfffffffffffffff8) {
          auVar48 = ZEXT3264(*pauVar28);
          uVar10 = vcmpps_avx512vl(*pauVar28,auVar38,1);
          if ((char)uVar10 != '\0') {
            do {
              auVar39 = auVar48._0_32_;
              uVar29 = (uint)uVar30;
              local_5860 = auVar55._0_32_;
              local_5900 = auVar61._0_32_;
              local_5880 = auVar56._0_32_;
              local_5920 = auVar62._0_32_;
              local_58a0 = auVar57._0_32_;
              local_5940 = auVar63._0_32_;
              local_58c0 = auVar59._0_32_;
              if ((uVar30 & 8) != 0) {
                if (uVar30 == 0xfffffffffffffff8) goto LAB_00887bc2;
                uVar25 = vcmpps_avx512vl(auVar38,auVar39,6);
                uVar33 = (ushort)uVar25;
                if ((byte)uVar25 != 0) {
                  uVar23 = (ulong)(uVar29 & 0xf);
                  if (uVar23 != 8) {
                    lVar24 = 0;
                    local_58e0 = auVar38;
                    do {
                      local_5988.geomID = *(uint *)((uVar30 & 0xfffffffffffffff0) + lVar24 * 8);
                      local_5958 = (context->scene->geometries).items[local_5988.geomID].ptr;
                      uVar29 = local_5958->mask;
                      auVar38._4_4_ = uVar29;
                      auVar38._0_4_ = uVar29;
                      auVar38._8_4_ = uVar29;
                      auVar38._12_4_ = uVar29;
                      auVar38._16_4_ = uVar29;
                      auVar38._20_4_ = uVar29;
                      auVar38._24_4_ = uVar29;
                      auVar38._28_4_ = uVar29;
                      uVar26 = vptestmd_avx512vl(auVar38,*(undefined1 (*) [32])(ray + 0x120));
                      uVar26 = uVar25 & 0xff & uVar26;
                      if ((char)uVar26 != '\0') {
                        local_5988.primID =
                             *(uint *)((uVar30 & 0xfffffffffffffff0) + 4 + lVar24 * 8);
                        local_5840 = vpmovm2d_avx512vl(uVar26);
                        local_5988.valid = (int *)local_5840;
                        local_5988.geometryUserPtr = local_5958->userPtr;
                        local_5988.context = context->user;
                        local_5988.N = 8;
                        local_5950 = 0;
                        local_5948 = context->args;
                        pp_Var22 = (_func_int **)local_5948->intersect;
                        if (pp_Var22 == (_func_int **)0x0) {
                          pp_Var22 = local_5958[1].super_RefCount._vptr_RefCount;
                        }
                        local_5988.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var22)(&local_5988);
                        auVar55 = ZEXT3264(local_5860);
                        auVar56 = ZEXT3264(local_5880);
                        auVar57 = ZEXT3264(local_58a0);
                        auVar58 = ZEXT3264(CONCAT428(0x7f800000,
                                                     CONCAT424(0x7f800000,
                                                               CONCAT420(0x7f800000,
                                                                         CONCAT416(0x7f800000,
                                                                                   CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar59 = ZEXT3264(local_58c0);
                        auVar60 = ZEXT3264(local_58e0);
                        auVar61 = ZEXT3264(local_5900);
                        auVar62 = ZEXT3264(local_5920);
                        auVar63 = ZEXT3264(local_5940);
                      }
                      auVar38 = auVar60._0_32_;
                      lVar24 = lVar24 + 1;
                    } while (uVar23 - 8 != lVar24);
                  }
                  bVar3 = (bool)((byte)uVar25 & 1);
                  bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar33 >> 2) & 1);
                  bVar5 = (bool)((byte)(uVar33 >> 3) & 1);
                  bVar6 = (bool)((byte)(uVar33 >> 4) & 1);
                  bVar7 = (bool)((byte)(uVar33 >> 5) & 1);
                  bVar8 = (bool)((byte)(uVar33 >> 6) & 1);
                  bVar9 = (bool)((byte)(uVar33 >> 7) & 1);
                  auVar60 = ZEXT3264(CONCAT428((uint)bVar9 * *(int *)(ray + 0x11c) |
                                               (uint)!bVar9 * auVar38._28_4_,
                                               CONCAT424((uint)bVar8 * *(int *)(ray + 0x118) |
                                                         (uint)!bVar8 * auVar38._24_4_,
                                                         CONCAT420((uint)bVar7 *
                                                                   *(int *)(ray + 0x114) |
                                                                   (uint)!bVar7 * auVar38._20_4_,
                                                                   CONCAT416((uint)bVar6 *
                                                                             *(int *)(ray + 0x110) |
                                                                             (uint)!bVar6 *
                                                                             auVar38._16_4_,
                                                                             CONCAT412((uint)bVar5 *
                                                                                       *(int *)(ray 
                                                  + 0x10c) | (uint)!bVar5 * auVar38._12_4_,
                                                  CONCAT48((uint)bVar4 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar4 * auVar38._8_4_,
                                                           CONCAT44((uint)bVar31 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar31 * auVar38._4_4_,
                                                                    (uint)bVar3 *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!bVar3 * auVar38._0_4_))))
                                                  ))));
                }
                break;
              }
              uVar23 = uVar30 & 0xfffffffffffffff0;
              uVar26 = 0;
              auVar48 = ZEXT3264(auVar58._0_32_);
              uVar25 = 0;
              uVar30 = 8;
              do {
                uVar2 = *(ulong *)(uVar23 + uVar25 * 8);
                if (uVar2 != 8) {
                  uVar1 = *(undefined4 *)(uVar23 + 0x100 + uVar25 * 4);
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar49._16_4_ = uVar1;
                  auVar49._20_4_ = uVar1;
                  auVar49._24_4_ = uVar1;
                  auVar49._28_4_ = uVar1;
                  auVar36 = *(undefined1 (*) [32])(ray + 0xe0);
                  uVar1 = *(undefined4 *)(uVar23 + 0x40 + uVar25 * 4);
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  auVar45._16_4_ = uVar1;
                  auVar45._20_4_ = uVar1;
                  auVar45._24_4_ = uVar1;
                  auVar45._28_4_ = uVar1;
                  auVar37 = vfmadd213ps_avx512vl(auVar49,auVar36,auVar45);
                  uVar1 = *(undefined4 *)(uVar23 + 0x140 + uVar25 * 4);
                  auVar50._4_4_ = uVar1;
                  auVar50._0_4_ = uVar1;
                  auVar50._8_4_ = uVar1;
                  auVar50._12_4_ = uVar1;
                  auVar50._16_4_ = uVar1;
                  auVar50._20_4_ = uVar1;
                  auVar50._24_4_ = uVar1;
                  auVar50._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar23 + 0x80 + uVar25 * 4);
                  auVar46._4_4_ = uVar1;
                  auVar46._0_4_ = uVar1;
                  auVar46._8_4_ = uVar1;
                  auVar46._12_4_ = uVar1;
                  auVar46._16_4_ = uVar1;
                  auVar46._20_4_ = uVar1;
                  auVar46._24_4_ = uVar1;
                  auVar46._28_4_ = uVar1;
                  auVar35 = vfmadd213ps_avx512vl(auVar50,auVar36,auVar46);
                  uVar1 = *(undefined4 *)(uVar23 + 0x180 + uVar25 * 4);
                  auVar51._4_4_ = uVar1;
                  auVar51._0_4_ = uVar1;
                  auVar51._8_4_ = uVar1;
                  auVar51._12_4_ = uVar1;
                  auVar51._16_4_ = uVar1;
                  auVar51._20_4_ = uVar1;
                  auVar51._24_4_ = uVar1;
                  auVar51._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar23 + 0xc0 + uVar25 * 4);
                  auVar16._4_4_ = uVar1;
                  auVar16._0_4_ = uVar1;
                  auVar16._8_4_ = uVar1;
                  auVar16._12_4_ = uVar1;
                  auVar16._16_4_ = uVar1;
                  auVar16._20_4_ = uVar1;
                  auVar16._24_4_ = uVar1;
                  auVar16._28_4_ = uVar1;
                  auVar40 = vfmadd213ps_avx512vl(auVar51,auVar36,auVar16);
                  uVar1 = *(undefined4 *)(uVar23 + 0x120 + uVar25 * 4);
                  auVar52._4_4_ = uVar1;
                  auVar52._0_4_ = uVar1;
                  auVar52._8_4_ = uVar1;
                  auVar52._12_4_ = uVar1;
                  auVar52._16_4_ = uVar1;
                  auVar52._20_4_ = uVar1;
                  auVar52._24_4_ = uVar1;
                  auVar52._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar23 + 0x60 + uVar25 * 4);
                  auVar17._4_4_ = uVar1;
                  auVar17._0_4_ = uVar1;
                  auVar17._8_4_ = uVar1;
                  auVar17._12_4_ = uVar1;
                  auVar17._16_4_ = uVar1;
                  auVar17._20_4_ = uVar1;
                  auVar17._24_4_ = uVar1;
                  auVar17._28_4_ = uVar1;
                  auVar41 = vfmadd213ps_avx512vl(auVar52,auVar36,auVar17);
                  uVar1 = *(undefined4 *)(uVar23 + 0x160 + uVar25 * 4);
                  auVar53._4_4_ = uVar1;
                  auVar53._0_4_ = uVar1;
                  auVar53._8_4_ = uVar1;
                  auVar53._12_4_ = uVar1;
                  auVar53._16_4_ = uVar1;
                  auVar53._20_4_ = uVar1;
                  auVar53._24_4_ = uVar1;
                  auVar53._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar23 + 0xa0 + uVar25 * 4);
                  auVar18._4_4_ = uVar1;
                  auVar18._0_4_ = uVar1;
                  auVar18._8_4_ = uVar1;
                  auVar18._12_4_ = uVar1;
                  auVar18._16_4_ = uVar1;
                  auVar18._20_4_ = uVar1;
                  auVar18._24_4_ = uVar1;
                  auVar18._28_4_ = uVar1;
                  auVar42 = vfmadd213ps_avx512vl(auVar53,auVar36,auVar18);
                  uVar1 = *(undefined4 *)(uVar23 + 0x1a0 + uVar25 * 4);
                  auVar54._4_4_ = uVar1;
                  auVar54._0_4_ = uVar1;
                  auVar54._8_4_ = uVar1;
                  auVar54._12_4_ = uVar1;
                  auVar54._16_4_ = uVar1;
                  auVar54._20_4_ = uVar1;
                  auVar54._24_4_ = uVar1;
                  auVar54._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar23 + 0xe0 + uVar25 * 4);
                  auVar19._4_4_ = uVar1;
                  auVar19._0_4_ = uVar1;
                  auVar19._8_4_ = uVar1;
                  auVar19._12_4_ = uVar1;
                  auVar19._16_4_ = uVar1;
                  auVar19._20_4_ = uVar1;
                  auVar19._24_4_ = uVar1;
                  auVar19._28_4_ = uVar1;
                  auVar43 = vfmadd213ps_avx512vl(auVar54,auVar36,auVar19);
                  auVar44 = vfmadd213ps_avx512vl(auVar37,local_5860,local_5900);
                  auVar45 = vfmadd213ps_avx512vl(auVar35,local_5880,local_5920);
                  auVar46 = vfmadd213ps_avx512vl(auVar40,local_58a0,local_5940);
                  auVar40 = vfmadd213ps_avx512vl(auVar41,local_5860,local_5900);
                  auVar41 = vfmadd213ps_avx512vl(auVar42,local_5880,local_5920);
                  auVar42 = vfmadd213ps_avx512vl(auVar43,local_58a0,local_5940);
                  auVar37 = vpminsd_avx2(auVar44,auVar40);
                  auVar35 = vpminsd_avx2(auVar45,auVar41);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar35);
                  auVar35 = vpminsd_avx2(auVar46,auVar42);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar35);
                  auVar35 = vpmaxsd_avx2(auVar44,auVar40);
                  auVar40 = vpmaxsd_avx2(auVar45,auVar41);
                  auVar41 = vpminsd_avx2(auVar35,auVar40);
                  auVar35 = vpmaxsd_avx2(auVar46,auVar42);
                  auVar40 = vpmaxsd_avx2(auVar37,local_58c0);
                  auVar35 = vpminsd_avx512vl(auVar35,auVar38);
                  auVar35 = vpminsd_avx2(auVar41,auVar35);
                  uVar34 = vcmpps_avx512vl(auVar40,auVar35,2);
                  if ((uVar29 & 7) == 6) {
                    uVar1 = *(undefined4 *)(uVar23 + 0x1c0 + uVar25 * 4);
                    auVar20._4_4_ = uVar1;
                    auVar20._0_4_ = uVar1;
                    auVar20._8_4_ = uVar1;
                    auVar20._12_4_ = uVar1;
                    auVar20._16_4_ = uVar1;
                    auVar20._20_4_ = uVar1;
                    auVar20._24_4_ = uVar1;
                    auVar20._28_4_ = uVar1;
                    uVar11 = vcmpps_avx512vl(auVar36,auVar20,0xd);
                    uVar1 = *(undefined4 *)(uVar23 + 0x1e0 + uVar25 * 4);
                    auVar21._4_4_ = uVar1;
                    auVar21._0_4_ = uVar1;
                    auVar21._8_4_ = uVar1;
                    auVar21._12_4_ = uVar1;
                    auVar21._16_4_ = uVar1;
                    auVar21._20_4_ = uVar1;
                    auVar21._24_4_ = uVar1;
                    auVar21._28_4_ = uVar1;
                    uVar12 = vcmpps_avx512vl(auVar36,auVar21,1);
                    uVar34 = uVar34 & uVar11 & uVar12;
                  }
                  uVar11 = vcmpps_avx512vl(auVar38,auVar39,6);
                  uVar34 = uVar34 & uVar11;
                  if ((byte)uVar34 != 0) {
                    auVar37 = vblendmps_avx512vl(auVar58._0_32_,auVar37);
                    bVar31 = (bool)((byte)uVar34 & 1);
                    auVar47._0_4_ = (uint)bVar31 * auVar37._0_4_ | (uint)!bVar31 * auVar36._0_4_;
                    bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
                    auVar47._4_4_ = (uint)bVar31 * auVar37._4_4_ | (uint)!bVar31 * auVar36._4_4_;
                    bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
                    auVar47._8_4_ = (uint)bVar31 * auVar37._8_4_ | (uint)!bVar31 * auVar36._8_4_;
                    bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
                    auVar47._12_4_ = (uint)bVar31 * auVar37._12_4_ | (uint)!bVar31 * auVar36._12_4_;
                    bVar31 = (bool)((byte)(uVar34 >> 4) & 1);
                    auVar47._16_4_ = (uint)bVar31 * auVar37._16_4_ | (uint)!bVar31 * auVar36._16_4_;
                    bVar31 = (bool)((byte)(uVar34 >> 5) & 1);
                    auVar47._20_4_ = (uint)bVar31 * auVar37._20_4_ | (uint)!bVar31 * auVar36._20_4_;
                    bVar31 = (bool)((byte)(uVar34 >> 6) & 1);
                    auVar47._24_4_ = (uint)bVar31 * auVar37._24_4_ | (uint)!bVar31 * auVar36._24_4_;
                    bVar31 = SUB81(uVar34 >> 7,0);
                    auVar47._28_4_ = (uint)bVar31 * auVar37._28_4_ | (uint)!bVar31 * auVar36._28_4_;
                    auVar35 = auVar48._0_32_;
                    uVar10 = vcmpps_avx512vl(auVar47,auVar35,1);
                    uVar34 = uVar2;
                    auVar36 = auVar35;
                    auVar37 = auVar47;
                    if (((char)uVar10 == '\0') ||
                       (bVar31 = uVar30 != 8, uVar34 = uVar30, uVar30 = uVar2, auVar36 = auVar47,
                       auVar37 = auVar35, bVar31)) {
                      uVar26 = uVar26 + 1;
                      *puVar27 = uVar34;
                      puVar27 = puVar27 + 1;
                      *pauVar28 = auVar37;
                      pauVar28 = pauVar28 + 1;
                      auVar48 = ZEXT3264(auVar36);
                    }
                    else {
                      auVar48 = ZEXT3264(auVar47);
                    }
                  }
                }
              } while ((uVar2 != 8) && (bVar31 = uVar25 < 7, uVar25 = uVar25 + 1, bVar31));
              if (1 < uVar26 && uVar30 != 8) {
                auVar39 = pauVar28[-2];
                uVar10 = vcmpps_avx512vl(auVar39,pauVar28[-1],1);
                if ((char)uVar10 != '\0') {
                  pauVar28[-2] = pauVar28[-1];
                  pauVar28[-1] = auVar39;
                  auVar15 = vpermilps_avx(*(undefined1 (*) [16])(puVar27 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar27 + -2) = auVar15;
                }
                if (uVar26 != 2) {
                  auVar39 = pauVar28[-3];
                  uVar10 = vcmpps_avx512vl(auVar39,pauVar28[-1],1);
                  if ((char)uVar10 != '\0') {
                    pauVar28[-3] = pauVar28[-1];
                    pauVar28[-1] = auVar39;
                    uVar25 = puVar27[-3];
                    puVar27[-3] = puVar27[-1];
                    puVar27[-1] = uVar25;
                  }
                  auVar39 = pauVar28[-3];
                  uVar10 = vcmpps_avx512vl(auVar39,pauVar28[-2],1);
                  if ((char)uVar10 != '\0') {
                    pauVar28[-3] = pauVar28[-2];
                    pauVar28[-2] = auVar39;
                    auVar15 = vpermilps_avx(*(undefined1 (*) [16])(puVar27 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar27 + -3) = auVar15;
                  }
                }
              }
            } while (uVar30 != 8);
          }
          bVar3 = false;
        }
LAB_00887bc2:
      } while (!bVar3);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }